

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_1;
  SignalEventExpressionSyntax *pSVar1;
  DeepCloneVisitor visitor;
  IffEventClauseSyntax *local_30;
  Token local_28;
  
  local_28 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x28),(DeepCloneVisitor *)&local_30,
                      (BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x30) == (SyntaxNode *)0x0) {
    local_30 = (IffEventClauseSyntax *)0x0;
  }
  else {
    local_30 = (IffEventClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x30),(DeepCloneVisitor *)&local_30,
                          (BumpAllocator *)__child_stack);
  }
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::SignalEventExpressionSyntax,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::syntax::IffEventClauseSyntax*>
                     ((BumpAllocator *)__child_stack,&local_28,(ExpressionSyntax *)args_1,&local_30)
  ;
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const SignalEventExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<SignalEventExpressionSyntax>(
        node.edge.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.iffClause ? deepClone(*node.iffClause, alloc) : nullptr
    );
}